

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImDrawCmd local_38;
  
  local_38.ElemCount = 0;
  local_38._36_4_ = 0;
  local_38.UserCallback = (ImDrawCallback)0x0;
  local_38.UserCallbackData = (void *)0x0;
  local_38.ClipRect.x = (this->_CmdHeader).ClipRect.x;
  local_38.ClipRect.y = (this->_CmdHeader).ClipRect.y;
  local_38.ClipRect.z = (this->_CmdHeader).ClipRect.z;
  local_38.ClipRect.w = (this->_CmdHeader).ClipRect.w;
  local_38.TextureId = (this->_CmdHeader).TextureId;
  local_38.VtxOffset = (this->_CmdHeader).VtxOffset;
  local_38.IdxOffset = (this->IdxBuffer).Size;
  if ((local_38.ClipRect.x <= local_38.ClipRect.z) && (local_38.ClipRect.y <= local_38.ClipRect.w))
  {
    ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&local_38);
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                ,0x1d1,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}